

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

CURLcode base64_encode(char *table64,char *inputbuff,size_t insize,char **outptr,size_t *outlen)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  
  *outptr = (char *)0x0;
  *outlen = 0;
  if (insize == 0) {
    insize = strlen(inputbuff);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = insize + 2;
  pcVar4 = (char *)malloc((SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) * 2
                          + 1);
  pcVar5 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  for (; 2 < insize; insize = insize - 3) {
    bVar1 = *inputbuff;
    *pcVar5 = table64[bVar1 >> 2];
    bVar2 = ((byte *)inputbuff)[1];
    pcVar5[1] = table64[(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
    bVar1 = ((byte *)inputbuff)[2];
    pcVar5[2] = table64[(uint)(bVar1 >> 6) + (bVar2 & 0xf) * 4];
    pcVar5[3] = table64[bVar1 & 0x3f];
    inputbuff = (char *)((byte *)inputbuff + 3);
    pcVar5 = pcVar5 + 4;
  }
  if (insize != 0) {
    bVar1 = *inputbuff;
    *pcVar5 = table64[bVar1 >> 2];
    uVar7 = (bVar1 & 3) << 4;
    if (insize == 1) {
      pcVar5[1] = table64[uVar7];
      cVar6 = table64[0x40];
      if (cVar6 == '\0') {
        pcVar5 = pcVar5 + 2;
        goto LAB_0012018b;
      }
      pcVar5[2] = cVar6;
    }
    else {
      bVar1 = ((byte *)inputbuff)[1];
      pcVar5[1] = table64[(byte)((byte)uVar7 | bVar1 >> 4)];
      pcVar5[2] = table64[(ulong)(bVar1 & 0xf) * 4];
      cVar6 = table64[0x40];
      if (cVar6 == '\0') {
        pcVar5 = pcVar5 + 3;
        goto LAB_0012018b;
      }
    }
    pcVar5[3] = cVar6;
    pcVar5 = pcVar5 + 4;
  }
LAB_0012018b:
  *pcVar5 = '\0';
  *outptr = pcVar4;
  *outlen = (long)pcVar5 - (long)pcVar4;
  return CURLE_OK;
}

Assistant:

static CURLcode base64_encode(const char *table64,
                              const char *inputbuff, size_t insize,
                              char **outptr, size_t *outlen)
{
  char *output;
  char *base64data;
  const unsigned char *in = (unsigned char *)inputbuff;
  const char *padstr = &table64[64];    /* Point to padding string. */

  *outptr = NULL;
  *outlen = 0;

  if(!insize)
    insize = strlen(inputbuff);

#if SIZEOF_SIZE_T == 4
  if(insize > UINT_MAX/4)
    return CURLE_OUT_OF_MEMORY;
#endif

  base64data = output = malloc((insize + 2) / 3 * 4 + 1);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  while(insize >= 3) {
    *output++ = table64[ in[0] >> 2 ];
    *output++ = table64[ ((in[0] & 0x03) << 4) | (in[1] >> 4) ];
    *output++ = table64[ ((in[1] & 0x0F) << 2) | ((in[2] & 0xC0) >> 6) ];
    *output++ = table64[ in[2] & 0x3F ];
    insize -= 3;
    in += 3;
  }
  if(insize) {
    /* this is only one or two bytes now */
    *output++ = table64[ in[0] >> 2 ];
    if(insize == 1) {
      *output++ = table64[ ((in[0] & 0x03) << 4) ];
      if(*padstr) {
        *output++ = *padstr;
        *output++ = *padstr;
      }
    }
    else {
      /* insize == 2 */
      *output++ = table64[ ((in[0] & 0x03) << 4) | ((in[1] & 0xF0) >> 4) ];
      *output++ = table64[ ((in[1] & 0x0F) << 2) ];
      if(*padstr)
        *output++ = *padstr;
    }
  }

  /* Zero terminate */
  *output = '\0';

  /* Return the pointer to the new data (allocated memory) */
  *outptr = base64data;

  /* Return the length of the new data */
  *outlen = (size_t)(output - base64data);

  return CURLE_OK;
}